

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidget.cpp
# Opt level: O0

QScreen * __thiscall QWidgetPrivate::associatedScreen(QWidgetPrivate *this)

{
  QGraphicsProxyWidget *pQVar1;
  QWindow *pQVar2;
  QWidgetPrivate *in_RDI;
  WindowHandleMode unaff_retaddr;
  QWidgetPrivate *in_stack_00000008;
  QWindow *window;
  QWidget *in_stack_ffffffffffffffd8;
  undefined8 local_8;
  
  q_func(in_RDI);
  pQVar1 = nearestGraphicsProxyWidget(in_stack_ffffffffffffffd8);
  if (pQVar1 == (QGraphicsProxyWidget *)0x0) {
    pQVar2 = windowHandle(in_stack_00000008,unaff_retaddr);
    if (pQVar2 == (QWindow *)0x0) {
      local_8 = (QScreen *)0x0;
    }
    else {
      local_8 = (QScreen *)QWindow::screen();
    }
  }
  else {
    local_8 = (QScreen *)0x0;
  }
  return local_8;
}

Assistant:

QScreen *QWidgetPrivate::associatedScreen() const
{
#if QT_CONFIG(graphicsview)
    // embedded widgets never have a screen associated, let QWidget::screen fall back to toplevel
    if (nearestGraphicsProxyWidget(q_func()))
        return nullptr;
#endif
    if (auto window = windowHandle(WindowHandleMode::Closest))
        return window->screen();
    return nullptr;
}